

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool cycle_values_replace_placeholder_proc(Am_Object *ph,Am_Value *new_value,Am_Object *param_3)

{
  unsigned_short uVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  int local_34;
  undefined1 local_30 [4];
  int count;
  Am_Value_List values;
  Am_Object *param_2_local;
  Am_Value *new_value_local;
  Am_Object *ph_local;
  
  values.item = (Am_List_Item *)param_3;
  Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
  pAVar2 = Am_Object::Get(ph,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30,pAVar2);
  pAVar2 = Am_Object::Get(ph,0xfb,0);
  local_34 = Am_Value::operator_cast_to_int(pAVar2);
  uVar1 = Am_Value_List::Length((Am_Value_List *)local_30);
  if (local_34 < (int)(uVar1 - 1)) {
    local_34 = local_34 + 1;
  }
  else {
    local_34 = 0;
  }
  Am_Object::Set(ph,0xfb,local_34,0);
  pAVar2 = Am_Value_List::Get_Nth((Am_Value_List *)local_30,local_34);
  Am_Value::operator=(new_value,pAVar2);
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Got value ");
    poVar3 = operator<<(poVar3,new_value);
    poVar3 = std::operator<<(poVar3," as index ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
    poVar3 = std::operator<<(poVar3," from list ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_30);
    poVar3 = std::operator<<(poVar3," for ");
    poVar3 = operator<<(poVar3,ph);
    this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return true;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 cycle_values_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value,
                  Am_Object & /* sel_widget */))
{
  // if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid())
  //   ??should it start list each time initialized??
  ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
  Am_Value_List values = ph.Get(Am_VALUE);
  int count = ph.Get(Am_CURRENT_PHASE);
  //  ************* Beep when done option !!  ****
  if (count >= values.Length() - 1)
    count = 0;
  else
    count++;
  ph.Set(Am_CURRENT_PHASE, count);
  new_value = values.Get_Nth(count);
  if (am_sdebug)
    std::cout << "Got value " << new_value << " as index " << count
              << " from list " << values << " for " << ph << std::endl
              << std::flush;
  return true;
}